

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Ncurses::AttrOff
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  reference this;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args_local;
  
  bVar2 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::empty(Args);
  uVar1 = _stdscr;
  if (bVar2) {
    BasicValue::BasicValue(__return_storage_ptr__,-1);
  }
  else {
    this = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::front(Args);
    iVar3 = BasicValue::toInt(this);
    iVar3 = wattr_off(uVar1,iVar3,0);
    BasicValue::BasicValue(__return_storage_ptr__,iVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

BasicValue Ncurses::AttrOff(std::list<BasicValue> &Args) {
  if (Args.empty())
    return ERR;
  return attroff(Args.front().toInt());
}